

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O1

int SSL_CTX_use_certificate_ASN1(SSL_CTX *ctx,int len,uchar *d)

{
  bool bVar1;
  _Head_base<0UL,_crypto_buffer_st_*,_false> _Var2;
  uint uVar3;
  undefined4 in_register_00000034;
  UniquePtr<CRYPTO_BUFFER> buffer;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_20;
  UniquePtr<CRYPTO_BUFFER> local_18;
  
  uVar3 = 0;
  _Var2._M_head_impl =
       CRYPTO_BUFFER_new(d,CONCAT44(in_register_00000034,len),(CRYPTO_BUFFER_POOL *)0x0);
  local_20._M_head_impl = _Var2._M_head_impl;
  if (_Var2._M_head_impl != (CRYPTO_BUFFER *)0x0) {
    local_20._M_head_impl = (CRYPTO_BUFFER *)0x0;
    local_18._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)_Var2._M_head_impl;
    bVar1 = bssl::ssl_set_cert(*(CERT **)&ctx->read_ahead,&local_18);
    uVar3 = (uint)bVar1;
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_20);
  return uVar3;
}

Assistant:

int SSL_CTX_use_certificate_ASN1(SSL_CTX *ctx, size_t der_len,
                                 const uint8_t *der) {
  UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(der, der_len, NULL));
  if (!buffer) {
    return 0;
  }

  return ssl_set_cert(ctx->cert.get(), std::move(buffer));
}